

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::visitElse(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this)

{
  size_t sVar1;
  size_t sVar2;
  ScopeCtx *pSVar3;
  mapped_type *this_00;
  uint *puVar4;
  undefined1 local_1d0 [8];
  ScopeCtx scope;
  Result<wasm::Expression_*> _val;
  string local_70 [32];
  undefined1 local_50 [8];
  Result<wasm::Expression_*> expr;
  
  pSVar3 = getScope(this);
  ScopeCtx::ScopeCtx((ScopeCtx *)local_1d0,pSVar3);
  if (local_1d0 == (undefined1  [8])0x0 ||
      scope.scope.
      super__Variant_base<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
      .
      super__Move_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
      .
      super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
      .
      super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
      .
      super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
      .
      super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
      ._M_u._16_1_ != '\x03') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scope.startPos,"unexpected else",(allocator<char> *)local_50);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&scope.startPos)
    ;
    std::__cxx11::string::~string((string *)&scope.startPos);
  }
  else {
    finishScope((Result<wasm::Expression_*> *)local_50,this,(Block *)0x0);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)&scope.startPos,
               (_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)local_50);
    if (_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string(local_70,(string *)&scope.startPos);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_70);
      std::__cxx11::string::~string(local_70);
      std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)&scope.startPos);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)&scope.startPos);
      ((_Uninitialized<wasm::Expression_*,_true> *)((long)local_1d0 + 0x18))->_M_storage =
           (Expression *)local_50;
      if ((this->binaryPos != (size_t *)0x0) && (this->func != (Function *)0x0)) {
        sVar1 = this->lastBinaryPos;
        sVar2 = this->codeSectionOffset;
        scope.startPos = (size_t)local_1d0;
        this_00 = std::__detail::
                  _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->func->delimiterLocations,(key_type *)&scope.startPos);
        puVar4 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[](this_00,0);
        *puVar4 = (int)sVar1 - (int)sVar2;
      }
      ScopeCtx::makeElse((ScopeCtx *)&scope.startPos,(ScopeCtx *)local_1d0);
      pushScope(__return_storage_ptr__,this,(ScopeCtx *)&scope.startPos);
      ScopeCtx::~ScopeCtx((ScopeCtx *)&scope.startPos);
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_50);
  }
  ScopeCtx::~ScopeCtx((ScopeCtx *)local_1d0);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::visitElse() {
  auto scope = getScope();
  auto* iff = scope.getIf();
  if (!iff) {
    return Err{"unexpected else"};
  }
  auto expr = finishScope();
  CHECK_ERR(expr);
  iff->ifTrue = *expr;

  if (binaryPos && func) {
    func->delimiterLocations[iff][BinaryLocations::Else] =
      lastBinaryPos - codeSectionOffset;
  }

  return pushScope(ScopeCtx::makeElse(std::move(scope)));
}